

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sh.cpp
# Opt level: O0

void SHRotateXMinus(rot_data_t *c_in,rot_data_t *c_out,int lmax)

{
  int iVar1;
  float local_2c;
  int local_28;
  float local_24;
  int m;
  float s;
  int l;
  int lmax_local;
  rot_data_t *c_out_local;
  rot_data_t *c_in_local;
  
  SHRotateXPlus(c_in,c_out,lmax);
  for (m = 1; m <= lmax; m = m + 1) {
    local_2c = -1.0;
    if ((m & 1U) == 0) {
      local_2c = 1.0;
    }
    local_24 = local_2c;
    iVar1 = SHIndex(m,0);
    c_out[iVar1] = local_2c * c_out[iVar1];
    for (local_28 = 1; local_28 <= m; local_28 = local_28 + 1) {
      local_24 = -local_24;
      iVar1 = SHIndex(m,local_28);
      c_out[iVar1] = local_24 * c_out[iVar1];
      iVar1 = SHIndex(m,-local_28);
      c_out[iVar1] = -local_24 * c_out[iVar1];
    }
  }
  return;
}

Assistant:

void SHRotateXMinus(const rot_data_t *c_in, rot_data_t *c_out, int lmax) {
    // -x rotations are the same as +x rotations, just with a negation
    // factor thrown in for some of the terms.
    SHRotateXPlus(c_in, c_out, lmax);

    // l = 0 band is a no op...
    for (int l = 1; l <= lmax; ++l) {
        float s = (l & 0x1) ? -1.f : 1.f;
        c_out[SHIndex(l, 0)] *= s;
        for (int m = 1; m <= l; ++m) {
            s = -s;
            c_out[SHIndex(l, m)] *= s;
            c_out[SHIndex(l, -m)] *= -s;
        }
    }
}